

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O3

void bcf_enc_size(kstring_t *s,int size,int type)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (size < 0xf) {
    sVar1 = s->l;
    uVar3 = sVar1 + 1;
    if (uVar3 < s->m) {
      pcVar2 = s->s;
    }
    else {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
      sVar1 = s->l;
      uVar3 = sVar1 + 1;
    }
    size = size << 4 | type;
  }
  else {
    sVar1 = s->l;
    uVar3 = sVar1 + 1;
    if (uVar3 < s->m) {
      pcVar2 = s->s;
LAB_00117be5:
      s->l = uVar3;
      pcVar2[sVar1] = (byte)type | 0xf0;
      s->s[s->l] = '\0';
    }
    else {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        sVar1 = s->l;
        uVar3 = sVar1 + 1;
        goto LAB_00117be5;
      }
    }
    if (0x7f < (uint)size) {
      if ((uint)size < 0x8000) {
        sVar1 = s->l;
        uVar3 = sVar1 + 1;
        if (uVar3 < s->m) {
          pcVar2 = s->s;
LAB_00117e66:
          s->l = uVar3;
          pcVar2[sVar1] = '\x12';
          s->s[s->l] = '\0';
        }
        else {
          uVar3 = uVar3 >> 1 | uVar3;
          uVar3 = uVar3 >> 2 | uVar3;
          uVar3 = uVar3 >> 4 | uVar3;
          uVar3 = uVar3 >> 8 | uVar3;
          sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            sVar1 = s->l;
            uVar3 = sVar1 + 1;
            goto LAB_00117e66;
          }
        }
        sVar1 = s->l;
        uVar3 = sVar1 + 3;
        if (uVar3 < s->m) {
          pcVar2 = s->s;
        }
        else {
          uVar3 = uVar3 >> 1 | uVar3;
          uVar3 = uVar3 >> 2 | uVar3;
          uVar3 = uVar3 >> 4 | uVar3;
          uVar3 = uVar3 >> 8 | uVar3;
          sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
          sVar1 = s->l;
        }
        *(short *)(pcVar2 + sVar1) = (short)size;
        sVar1 = s->l + 2;
      }
      else {
        sVar1 = s->l;
        uVar3 = sVar1 + 1;
        if (uVar3 < s->m) {
          pcVar2 = s->s;
LAB_00117de9:
          s->l = uVar3;
          pcVar2[sVar1] = '\x13';
          s->s[s->l] = '\0';
        }
        else {
          uVar3 = uVar3 >> 1 | uVar3;
          uVar3 = uVar3 >> 2 | uVar3;
          uVar3 = uVar3 >> 4 | uVar3;
          uVar3 = uVar3 >> 8 | uVar3;
          sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            sVar1 = s->l;
            uVar3 = sVar1 + 1;
            goto LAB_00117de9;
          }
        }
        sVar1 = s->l;
        uVar3 = sVar1 + 5;
        if (uVar3 < s->m) {
          pcVar2 = s->s;
        }
        else {
          uVar3 = uVar3 >> 1 | uVar3;
          uVar3 = uVar3 >> 2 | uVar3;
          uVar3 = uVar3 >> 4 | uVar3;
          uVar3 = uVar3 >> 8 | uVar3;
          sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
          sVar1 = s->l;
        }
        *(int *)(pcVar2 + sVar1) = size;
        sVar1 = s->l + 4;
      }
      s->l = sVar1;
      pcVar2 = s->s + sVar1;
      goto LAB_00117f46;
    }
    sVar1 = s->l;
    uVar3 = sVar1 + 1;
    if (uVar3 < s->m) {
      pcVar2 = s->s;
LAB_00117d0b:
      s->l = uVar3;
      pcVar2[sVar1] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        sVar1 = s->l;
        uVar3 = sVar1 + 1;
        goto LAB_00117d0b;
      }
    }
    sVar1 = s->l;
    uVar3 = sVar1 + 1;
    if (uVar3 < s->m) {
      pcVar2 = s->s;
    }
    else {
      uVar3 = uVar3 >> 1 | uVar3;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      sVar4 = (uVar3 >> 0x10 | uVar3) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
      sVar1 = s->l;
      uVar3 = sVar1 + 1;
    }
  }
  s->l = uVar3;
  pcVar2[sVar1] = (char)size;
  pcVar2 = s->s + s->l;
LAB_00117f46:
  *pcVar2 = '\0';
  return;
}

Assistant:

static inline void bcf_enc_size(kstring_t *s, int size, int type)
{
    if (size >= 15) {
        kputc(15<<4|type, s);
        if (size >= 128) {
            if (size >= 32768) {
                int32_t x = size;
                kputc(1<<4|BCF_BT_INT32, s);
                kputsn((char*)&x, 4, s);
            } else {
                int16_t x = size;
                kputc(1<<4|BCF_BT_INT16, s);
                kputsn((char*)&x, 2, s);
            }
        } else {
            kputc(1<<4|BCF_BT_INT8, s);
            kputc(size, s);
        }
    } else kputc(size<<4|type, s);
}